

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

StackSize * __thiscall
miniscript::Node<XOnlyPubKey>::CalcStackSize
          (StackSize *__return_storage_ptr__,Node<XOnlyPubKey> *this)

{
  long lVar1;
  SatInfo in_dsat;
  SatInfo in_dsat_00;
  SatInfo in_dsat_01;
  SatInfo in_both;
  SatInfo in_both_00;
  SatInfo in_dsat_02;
  SatInfo in_dsat_03;
  SatInfo in_dsat_04;
  SatInfo in_dsat_05;
  SatInfo in_dsat_06;
  SatInfo in_dsat_07;
  SatInfo in_dsat_08;
  SatInfo in_dsat_09;
  SatInfo in_both_01;
  SatInfo in_both_02;
  SatInfo in_dsat_10;
  SatInfo in_dsat_11;
  SatInfo in_dsat_12;
  SatInfo in_dsat_13;
  SatInfo in_dsat_14;
  SatInfo in_sat;
  SatInfo in_sat_00;
  SatInfo in_sat_01;
  SatInfo in_sat_02;
  SatInfo in_sat_03;
  SatInfo in_sat_04;
  SatInfo in_sat_05;
  SatInfo in_sat_06;
  SatInfo in_sat_07;
  SatInfo in_sat_08;
  SatInfo in_sat_09;
  SatInfo in_sat_10;
  SatInfo in_sat_11;
  SatInfo in_sat_12;
  SatInfo in_sat_13;
  SatInfo in_sat_14;
  undefined3 uVar2;
  element_type *peVar3;
  size_type sVar4;
  reference this_00;
  reference pvVar5;
  long in_FS_OFFSET;
  StackSize *in_stack_ffffffffffffece8;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
  *in_stack_ffffffffffffecf0;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
  *in_stack_ffffffffffffecf8;
  undefined1 nonzero;
  SatInfo *in_stack_ffffffffffffed00;
  SatInfo *b;
  int32_t in_stack_ffffffffffffed08;
  int32_t iVar6;
  undefined4 in_stack_ffffffffffffed0c;
  undefined4 uVar7;
  reference in_stack_ffffffffffffed20;
  int32_t in_stack_ffffffffffffed28;
  undefined4 in_stack_ffffffffffffed2c;
  SatInfo *args;
  size_t j;
  size_t i;
  StackSize *y_6;
  StackSize *x_6;
  StackSize *y_5;
  StackSize *x_5;
  StackSize *y_4;
  StackSize *x_4;
  StackSize *y_3;
  StackSize *x_3;
  StackSize *y_2;
  StackSize *x_2;
  StackSize *y_1;
  StackSize *x_1;
  StackSize *z;
  StackSize *y;
  StackSize *x;
  Node<XOnlyPubKey> *this_local;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> next_sats;
  SatInfo add;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> sats;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat);
    miniscript::internal::SatInfo::Push();
    in_sat.exec = in_stack_ffffffffffffed28;
    in_sat._0_8_ = in_stack_ffffffffffffed20;
    in_dsat.exec = in_stack_ffffffffffffed08;
    in_dsat._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat,in_dsat);
    break;
  case JUST_1:
    miniscript::internal::SatInfo::Push();
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat);
    in_sat_00.exec = in_stack_ffffffffffffed28;
    in_sat_00._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_00.exec = in_stack_ffffffffffffed08;
    in_dsat_00._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_00,in_dsat_00);
    break;
  case PK_K:
    miniscript::internal::SatInfo::Push();
    in_both.exec = in_stack_ffffffffffffed08;
    in_both._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_both);
    break;
  case PK_H:
    miniscript::internal::SatInfo::OP_DUP();
    miniscript::internal::SatInfo::Hash();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::Push();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::OP_EQUALVERIFY();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_both_00.exec = in_stack_ffffffffffffed08;
    in_both_00._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_both_00);
    break;
  case OLDER:
  case AFTER:
    miniscript::internal::SatInfo::Push();
    miniscript::internal::SatInfo::Nop();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat);
    in_sat_01.exec = in_stack_ffffffffffffed28;
    in_sat_01._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_01.exec = in_stack_ffffffffffffed08;
    in_dsat_01._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_01,in_dsat_01);
    break;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    miniscript::internal::SatInfo::OP_SIZE();
    miniscript::internal::SatInfo::Push();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::OP_EQUALVERIFY();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::Hash();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::Push();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::OP_EQUAL();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat);
    in_sat_02.exec = in_stack_ffffffffffffed28;
    in_sat_02._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_02.exec = in_stack_ffffffffffffed08;
    in_dsat_02._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_02,in_dsat_02);
    break;
  case WRAP_A:
  case WRAP_S:
  case WRAP_N:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_ffffffffffffece8);
    uVar2 = *(undefined3 *)&(peVar3->ss).sat.field_0x1;
    iVar6 = (peVar3->ss).sat.netdiff;
    (__return_storage_ptr__->sat).valid = (peVar3->ss).sat.valid;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = uVar2;
    (__return_storage_ptr__->sat).netdiff = iVar6;
    *(undefined8 *)&(__return_storage_ptr__->sat).exec = *(undefined8 *)&(peVar3->ss).sat.exec;
    iVar6 = (peVar3->ss).dsat.exec;
    (__return_storage_ptr__->dsat).netdiff = (peVar3->ss).dsat.netdiff;
    (__return_storage_ptr__->dsat).exec = iVar6;
    break;
  case WRAP_C:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::OP_CHECKSIG();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::OP_CHECKSIG();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_10.exec = in_stack_ffffffffffffed28;
    in_sat_10._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_10.exec = in_stack_ffffffffffffed08;
    in_dsat_10._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_10,in_dsat_10);
    break;
  case WRAP_D:
    miniscript::internal::SatInfo::OP_DUP();
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::OP_DUP();
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_11.exec = in_stack_ffffffffffffed28;
    in_sat_11._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_11.exec = in_stack_ffffffffffffed08;
    in_dsat_11._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_11,in_dsat_11);
    break;
  case WRAP_V:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::OP_VERIFY();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat);
    in_sat_12.exec = in_stack_ffffffffffffed28;
    in_sat_12._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_12.exec = in_stack_ffffffffffffed08;
    in_dsat_12._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_12,in_dsat_12);
    break;
  case WRAP_J:
    miniscript::internal::SatInfo::OP_SIZE();
    miniscript::internal::SatInfo::OP_0NOTEQUAL();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::OP_SIZE();
    miniscript::internal::SatInfo::OP_0NOTEQUAL();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_13.exec = in_stack_ffffffffffffed28;
    in_sat_13._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_13.exec = in_stack_ffffffffffffed08;
    in_dsat_13._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_13,in_dsat_13);
    break;
  case AND_V:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat);
    in_sat_04.exec = in_stack_ffffffffffffed28;
    in_sat_04._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_04.exec = in_stack_ffffffffffffed08;
    in_dsat_04._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_04,in_dsat_04);
    break;
  case AND_B:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::BinaryOp();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::BinaryOp();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_05.exec = in_stack_ffffffffffffed28;
    in_sat_05._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_05.exec = in_stack_ffffffffffffed08;
    in_dsat_05._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_05,in_dsat_05);
    break;
  case OR_B:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator|
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::BinaryOp();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::BinaryOp();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_06.exec = in_stack_ffffffffffffed28;
    in_sat_06._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_06.exec = in_stack_ffffffffffffed08;
    in_dsat_06._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_06,in_dsat_06);
    break;
  case OR_C:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator|
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat);
    in_sat_07.exec = in_stack_ffffffffffffed28;
    in_sat_07._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_07.exec = in_stack_ffffffffffffed08;
    in_dsat_07._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_07,in_dsat_07);
    break;
  case OR_D:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    nonzero = (undefined1)((ulong)in_stack_ffffffffffffecf8 >> 0x38);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::OP_IFDUP((bool)nonzero);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::OP_IFDUP((bool)nonzero);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator|
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::OP_IFDUP((bool)nonzero);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_08.exec = in_stack_ffffffffffffed28;
    in_sat_08._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_08.exec = in_stack_ffffffffffffed08;
    in_dsat_08._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_08,in_dsat_08);
    break;
  case OR_I:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator|
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator|
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_09.exec = in_stack_ffffffffffffed28;
    in_sat_09._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_09.exec = in_stack_ffffffffffffed08;
    in_dsat_09._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_09,in_dsat_09);
    break;
  case ANDOR:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator|
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::SatInfo::If();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
               in_stack_ffffffffffffed00);
    in_sat_03.exec = in_stack_ffffffffffffed28;
    in_sat_03._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_03.exec = in_stack_ffffffffffffed08;
    in_dsat_03._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_03,in_dsat_03);
    break;
  case THRESH:
    miniscript::internal::SatInfo::Empty();
    Vector<miniscript::internal::SatInfo>
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
    args = (SatInfo *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28);
    for (i = 0; sVar4 = std::
                        vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                        ::size((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                                *)in_stack_ffffffffffffece8), i < sVar4; i = i + 1) {
      if (i == 0) {
        miniscript::internal::SatInfo::Empty();
      }
      else {
        miniscript::internal::SatInfo::BinaryOp();
      }
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      operator[](in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
      std::
      vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
      ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                    *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_ffffffffffffece8);
      miniscript::internal::operator+
                ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00);
      miniscript::internal::operator+
                ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00);
      Vector<miniscript::internal::SatInfo>(args);
      for (j = 1; sVar4 = std::
                          vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ::size((vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                  *)in_stack_ffffffffffffece8), j < sVar4; j = j + 1) {
        args = (SatInfo *)&sats;
        in_stack_ffffffffffffed20 =
             std::
             vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
             operator[](in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
        std::
        vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
        ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                      *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
        std::
        __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_ffffffffffffece8);
        miniscript::internal::operator+
                  ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                   in_stack_ffffffffffffed00);
        std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
        operator[](in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
        std::
        vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
        ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                      *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
        std::
        __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_ffffffffffffece8);
        miniscript::internal::operator+
                  ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                   in_stack_ffffffffffffed00);
        miniscript::internal::operator|
                  ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                   in_stack_ffffffffffffed00);
        miniscript::internal::operator+
                  ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                   in_stack_ffffffffffffed00);
        std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
        push_back((vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                   *)in_stack_ffffffffffffece8,(value_type *)0x1a677a1);
      }
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      size((vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> *)
           in_stack_ffffffffffffece8);
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      operator[](in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
      std::
      vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
      ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                    *)in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_ffffffffffffece8);
      miniscript::internal::operator+
                ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00);
      miniscript::internal::operator+
                ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00);
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      push_back((vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 *)in_stack_ffffffffffffece8,(value_type *)0x1a678e2);
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      operator=(in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      ~vector(in_stack_ffffffffffffecf8);
    }
    b = (SatInfo *)&sats;
    this_00 = std::
              vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ::operator[](in_stack_ffffffffffffecf8,(size_type)in_stack_ffffffffffffecf0);
    miniscript::internal::SatInfo::Push();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),b);
    miniscript::internal::SatInfo::OP_EQUAL();
    miniscript::internal::operator+
              ((SatInfo *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),b);
    pvVar5 = std::
             vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
             operator[]((vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                         *)this_00,(size_type)in_stack_ffffffffffffecf0);
    iVar6 = (int32_t)pvVar5;
    uVar7 = (undefined4)((ulong)pvVar5 >> 0x20);
    miniscript::internal::SatInfo::Push();
    miniscript::internal::operator+((SatInfo *)CONCAT44(uVar7,iVar6),b);
    miniscript::internal::SatInfo::OP_EQUAL();
    miniscript::internal::operator+((SatInfo *)CONCAT44(uVar7,iVar6),b);
    in_sat_14.exec = (int32_t)args;
    in_sat_14._0_8_ = in_stack_ffffffffffffed20;
    in_dsat_14.exec = iVar6;
    in_dsat_14._0_8_ = b;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_sat_14,in_dsat_14);
    std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
    ~vector((vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> *
            )this_00);
    break;
  case MULTI:
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat,0,0x1a66b3e);
    in_both_01.exec = in_stack_ffffffffffffed08;
    in_both_01._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_both_01);
    break;
  case MULTI_A:
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_ffffffffffffece8);
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_ffffffffffffece8);
    miniscript::internal::SatInfo::SatInfo(&in_stack_ffffffffffffece8->sat,0,0x1a66bc0);
    in_both_02.exec = in_stack_ffffffffffffed08;
    in_both_02._0_8_ = in_stack_ffffffffffffed00;
    miniscript::internal::StackSize::StackSize(in_stack_ffffffffffffece8,in_both_02);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x452,
                  "internal::StackSize miniscript::Node<XOnlyPubKey>::CalcStackSize() const [Key = XOnlyPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

internal::StackSize CalcStackSize() const {
        using namespace internal;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, SatInfo::Push()};
            case Fragment::JUST_1: return {SatInfo::Push(), {}};
            case Fragment::OLDER:
            case Fragment::AFTER: return {SatInfo::Push() + SatInfo::Nop(), {}};
            case Fragment::PK_K: return {SatInfo::Push()};
            case Fragment::PK_H: return {SatInfo::OP_DUP() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY()};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {
                SatInfo::OP_SIZE() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUAL(),
                {}
            };
            case Fragment::ANDOR: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                const auto& z{subs[2]->ss};
                return {
                    (x.sat + SatInfo::If() + y.sat) | (x.dsat + SatInfo::If() + z.sat),
                    x.dsat + SatInfo::If() + z.dsat
                };
            }
            case Fragment::AND_V: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat, {}};
            }
            case Fragment::AND_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat + SatInfo::BinaryOp(), x.dsat + y.dsat + SatInfo::BinaryOp()};
            }
            case Fragment::OR_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    ((x.sat + y.dsat) | (x.dsat + y.sat)) + SatInfo::BinaryOp(),
                    x.dsat + y.dsat + SatInfo::BinaryOp()
                };
            }
            case Fragment::OR_C: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {(x.sat + SatInfo::If()) | (x.dsat + SatInfo::If() + y.sat), {}};
            }
            case Fragment::OR_D: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    (x.sat + SatInfo::OP_IFDUP(true) + SatInfo::If()) | (x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.sat),
                    x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.dsat
                };
            }
            case Fragment::OR_I: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {SatInfo::If() + (x.sat | y.sat), SatInfo::If() + (x.dsat | y.dsat)};
            }
            // multi(k, key1, key2, ..., key_n) starts off with k+1 stack elements (a 0, plus k
            // signatures), then reaches n+k+3 stack elements after pushing the n keys, plus k and
            // n itself, and ends with 1 stack element (success or failure). Thus, it net removes
            // k elements (from k+1 to 1), while reaching k+n+2 more than it ends with.
            case Fragment::MULTI: return {SatInfo(k, k + keys.size() + 2)};
            // multi_a(k, key1, key2, ..., key_n) starts off with n stack elements (the
            // signatures), reaches 1 more (after the first key push), and ends with 1. Thus it net
            // removes n-1 elements (from n to 1) while reaching n more than it ends with.
            case Fragment::MULTI_A: return {SatInfo(keys.size() - 1, keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S: return subs[0]->ss;
            case Fragment::WRAP_C: return {
                subs[0]->ss.sat + SatInfo::OP_CHECKSIG(),
                subs[0]->ss.dsat + SatInfo::OP_CHECKSIG()
            };
            case Fragment::WRAP_D: return {
                SatInfo::OP_DUP() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_DUP() + SatInfo::If()
            };
            case Fragment::WRAP_V: return {subs[0]->ss.sat + SatInfo::OP_VERIFY(), {}};
            case Fragment::WRAP_J: return {
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If()
            };
            case Fragment::THRESH: {
                // sats[j] is the SatInfo corresponding to all traces reaching j satisfactions.
                auto sats = Vector(SatInfo::Empty());
                for (size_t i = 0; i < subs.size(); ++i) {
                    // Loop over the subexpressions, processing them one by one. After adding
                    // element i we need to add OP_ADD (if i>0).
                    auto add = i ? SatInfo::BinaryOp() : SatInfo::Empty();
                    // Construct a variable that will become the next sats, starting with index 0.
                    auto next_sats = Vector(sats[0] + subs[i]->ss.dsat + add);
                    // Then loop to construct next_sats[1..i].
                    for (size_t j = 1; j < sats.size(); ++j) {
                        next_sats.push_back(((sats[j] + subs[i]->ss.dsat) | (sats[j - 1] + subs[i]->ss.sat)) + add);
                    }
                    // Finally construct next_sats[i+1].
                    next_sats.push_back(sats[sats.size() - 1] + subs[i]->ss.sat + add);
                    // Switch over.
                    sats = std::move(next_sats);
                }
                // To satisfy thresh we need k satisfactions; to dissatisfy we need 0. In both
                // cases a push of k and an OP_EQUAL follow.
                return {
                    sats[k] + SatInfo::Push() + SatInfo::OP_EQUAL(),
                    sats[0] + SatInfo::Push() + SatInfo::OP_EQUAL()
                };
            }
        }
        assert(false);
    }